

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

int STRING_compare(STRING_HANDLE s1,STRING_HANDLE s2)

{
  STRING *value2;
  STRING *value1;
  int result;
  STRING_HANDLE s2_local;
  STRING_HANDLE s1_local;
  
  if ((s1 == (STRING_HANDLE)0x0) && (s2 == (STRING_HANDLE)0x0)) {
    value1._4_4_ = 0;
  }
  else if (s1 == (STRING_HANDLE)0x0) {
    value1._4_4_ = 1;
  }
  else if (s2 == (STRING_HANDLE)0x0) {
    value1._4_4_ = -1;
  }
  else {
    value1._4_4_ = strcmp(s1->s,s2->s);
  }
  return value1._4_4_;
}

Assistant:

int STRING_compare(STRING_HANDLE s1, STRING_HANDLE s2)
{
    int result;
    if (s1 == NULL && s2 == NULL)
    {
        /* Codes_SRS_STRING_07_035: [If h1 and h2 are both NULL then STRING_compare shall return 0.]*/
        result = 0;
    }
    else if (s1 == NULL)
    {
        /* Codes_SRS_STRING_07_036: [If h1 is NULL and h2 is nonNULL then STRING_compare shall return 1.]*/
        result = 1;
    }
    else if (s2 == NULL)
    {
        /* Codes_SRS_STRING_07_037: [If h2 is NULL and h1 is nonNULL then STRING_compare shall return -1.] */
        result = -1;
    }
    else
    {
        /* Codes_SRS_STRING_07_038: [STRING_compare shall compare the char s variable using the strcmp function.] */
        STRING* value1 = (STRING*)s1;
        STRING* value2 = (STRING*)s2;
        result = strcmp(value1->s, value2->s);
    }
    return result;
}